

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma_back.c
# Opt level: O2

void parse_renouveau_startup(state *s,char *path)

{
  FILE *__stream;
  char *pcVar1;
  FILE *__stream_00;
  int *piVar2;
  char *pcVar3;
  char *buf;
  
  buf = (char *)0x0;
  asprintf(&buf,"%s/card_%04x-%04x_test_startup.txt",path,(ulong)(s->pci_id >> 0x10),
           (ulong)(s->pci_id & 0xffff));
  __stream_00 = fopen(buf,"r");
  pcVar1 = buf;
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"Couldn\'t open %s: %s\n",pcVar1,pcVar3);
  }
  else {
    dedma(s,(FILE *)__stream_00,true);
    fclose(__stream_00);
  }
  free(buf);
  return;
}

Assistant:

void
parse_renouveau_startup(struct state *s, char *path)
{
	char *buf = NULL;
	FILE *f;

	asprintf(&buf, "%s/card_%04x-%04x_test_startup.txt", path,
		 s->pci_id >> 16, s->pci_id & 0xffff);
	f = fopen(buf, "r");
	if (!f) {
		fprintf(stderr, "Couldn't open %s: %s\n", buf,
			strerror(errno));
		goto out;
	}

	dedma(s, f, true);

	fclose(f);
out:
	free(buf);
}